

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

uintwide_t<512U,_unsigned_int,_void,_false> * __thiscall
math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>::operator*=
          (uintwide_t<512U,_unsigned_int,_void,_false> *this,
          uintwide_t<512U,_unsigned_int,_void,_false> *other)

{
  uintwide_t<512U,_unsigned_int,_void,_false> other_as_self_copy;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  uintwide_t<512U,_unsigned_int,_void,_false> local_58;
  
  if (this == other) {
    local_58.values.super_array<unsigned_int,_16UL>.elems._0_8_ =
         *(undefined8 *)(other->values).super_array<unsigned_int,_16UL>.elems;
    local_58.values.super_array<unsigned_int,_16UL>.elems._8_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_16UL>.elems + 2);
    local_58.values.super_array<unsigned_int,_16UL>.elems._16_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_16UL>.elems + 4);
    local_58.values.super_array<unsigned_int,_16UL>.elems._24_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_16UL>.elems + 6);
    local_58.values.super_array<unsigned_int,_16UL>.elems._32_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_16UL>.elems + 8);
    local_58.values.super_array<unsigned_int,_16UL>.elems._40_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_16UL>.elems + 10);
    local_58.values.super_array<unsigned_int,_16UL>.elems._48_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_16UL>.elems + 0xc);
    local_58.values.super_array<unsigned_int,_16UL>.elems._56_8_ =
         *(undefined8 *)((other->values).super_array<unsigned_int,_16UL>.elems + 0xe);
    other = &local_58;
  }
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  eval_multiply_n_by_n_to_lo_part<unsigned_int_*,_const_unsigned_int_*,_const_unsigned_int_*,_512U,_nullptr>
            ((uint *)&local_98,(uint *)this,(uint *)other,0x10);
  *(undefined8 *)((this->values).super_array<unsigned_int,_16UL>.elems + 0xc) = local_68;
  *(undefined8 *)((this->values).super_array<unsigned_int,_16UL>.elems + 0xe) = uStack_60;
  *(undefined8 *)((this->values).super_array<unsigned_int,_16UL>.elems + 8) = local_78;
  *(undefined8 *)((this->values).super_array<unsigned_int,_16UL>.elems + 10) = uStack_70;
  *(undefined8 *)((this->values).super_array<unsigned_int,_16UL>.elems + 4) = local_88;
  *(undefined8 *)((this->values).super_array<unsigned_int,_16UL>.elems + 6) = uStack_80;
  *(undefined8 *)(this->values).super_array<unsigned_int,_16UL>.elems = local_98;
  *(undefined8 *)((this->values).super_array<unsigned_int,_16UL>.elems + 2) = uStack_90;
  return this;
}

Assistant:

constexpr auto operator*=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t other_as_self_copy(other); // NOLINT(performance-unnecessary-copy-initialization)

        eval_mul_unary(*this, other_as_self_copy);
      }
      else
      {
        eval_mul_unary(*this, other);
      }

      return *this;
    }